

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O0

void duckdb::ArgMinMaxBase<duckdb::LessThan,false>::
     Execute<double,int,duckdb::ArgMinMaxState<double,int>>
               (ArgMinMaxState<double,_int> *state,double x_data,int y_data,
               AggregateBinaryInput *binary)

{
  bool bVar1;
  int *in_RDX;
  undefined4 in_ESI;
  undefined8 in_RDI;
  undefined1 x_null;
  ArgMinMaxState<double,_int> *in_XMM0_Qa;
  int *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe8;
  
  x_null = (undefined1)((ulong)in_RDI >> 0x38);
  bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                    ((TemplatedValidityMask<unsigned_long> *)
                     CONCAT44(in_ESI,in_stack_ffffffffffffffe8),(idx_t)in_RDX);
  if ((bVar1) && (bVar1 = LessThan::Operation<int>(in_RDX,in_stack_ffffffffffffffd8), bVar1)) {
    TemplatedValidityMask<unsigned_long>::RowIsValid
              ((TemplatedValidityMask<unsigned_long> *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
               (idx_t)in_RDX);
    Assign<double,int,duckdb::ArgMinMaxState<double,int>>
              (in_XMM0_Qa,(double *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDX,(bool)x_null);
  }
  return;
}

Assistant:

static void Execute(STATE &state, A_TYPE x_data, B_TYPE y_data, AggregateBinaryInput &binary) {
		if ((IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) && COMPARATOR::Operation(y_data, state.value)) {
			Assign(state, x_data, y_data, !binary.left_mask.RowIsValid(binary.lidx));
		}
	}